

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::endFunction(SymbolData *this,int64_t address)

{
  reference pvVar1;
  reference pvVar2;
  SymDataFunction *func;
  int64_t address_local;
  SymbolData *this_local;
  
  if (this->currentFunction == -1) {
    Logger::printError<>(Error,"Not inside a function");
  }
  else {
    pvVar1 = std::vector<SymDataModule,_std::allocator<SymDataModule>_>::operator[]
                       (&this->modules,(long)this->currentModule);
    pvVar2 = std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::operator[]
                       (&pvVar1->functions,(long)this->currentFunction);
    pvVar2->size = address - pvVar2->address;
    this->currentFunction = -1;
  }
  return;
}

Assistant:

void SymbolData::endFunction(int64_t address)
{
	if (currentFunction == -1)
	{
		Logger::printError(Logger::Error, "Not inside a function");
		return;
	}

	SymDataFunction& func = modules[currentModule].functions[currentFunction];
	func.size = (size_t) (address-func.address);
	currentFunction = -1;
}